

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_8x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int8_t *piVar4;
  undefined7 in_register_00000009;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar135 [16];
  __m128i out [16];
  __m128i in [16];
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  undefined8 local_138;
  longlong lStack_130;
  __m128i local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  undefined1 local_68 [16];
  int local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  
  piVar4 = av1_fwd_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar122._8_4_ = auVar14._8_4_;
    auVar122._12_4_ = auVar14._12_4_;
    auVar122._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar122,auVar122);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar96._8_4_ = auVar34._8_4_;
    auVar96._12_4_ = auVar34._12_4_;
    auVar96._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar96,auVar96);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar85._8_4_ = auVar52._8_4_;
    auVar85._12_4_ = auVar52._12_4_;
    auVar85._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar85,auVar85);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar61._8_4_ = auVar67._8_4_;
    auVar61._12_4_ = auVar67._12_4_;
    auVar61._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar61,auVar61);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar45._8_4_ = auVar79._8_4_;
    auVar45._12_4_ = auVar79._12_4_;
    auVar45._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar45,auVar45);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar23._8_4_ = auVar89._8_4_;
    auVar23._12_4_ = auVar89._12_4_;
    auVar23._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar23,auVar23);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar8._8_4_ = auVar103._8_4_;
    auVar8._12_4_ = auVar103._12_4_;
    auVar8._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar8,auVar8);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar24._0_8_ = auVar116._8_8_;
    auVar24._8_4_ = auVar116._8_4_;
    auVar24._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar24,auVar24);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    fdct4x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1(&local_128,(__m128i *)&local_228,0xd,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    goto LAB_0041611e;
  case 1:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar130._8_4_ = auVar14._8_4_;
    auVar130._12_4_ = auVar14._12_4_;
    auVar130._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar130,auVar130);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar106._8_4_ = auVar34._8_4_;
    auVar106._12_4_ = auVar34._12_4_;
    auVar106._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar106,auVar106);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar91._8_4_ = auVar52._8_4_;
    auVar91._12_4_ = auVar52._12_4_;
    auVar91._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar91,auVar91);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar70._8_4_ = auVar67._8_4_;
    auVar70._12_4_ = auVar67._12_4_;
    auVar70._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar70,auVar70);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar55._8_4_ = auVar79._8_4_;
    auVar55._12_4_ = auVar79._12_4_;
    auVar55._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar55,auVar55);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar37._8_4_ = auVar89._8_4_;
    auVar37._12_4_ = auVar89._12_4_;
    auVar37._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar37,auVar37);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar17._8_4_ = auVar103._8_4_;
    auVar17._12_4_ = auVar103._12_4_;
    auVar17._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar17,auVar17);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar38._0_8_ = auVar116._8_8_;
    auVar38._8_4_ = auVar116._8_4_;
    auVar38._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar38,auVar38);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    goto LAB_00415dc3;
  case 2:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar128._8_4_ = auVar14._8_4_;
    auVar128._12_4_ = auVar14._12_4_;
    auVar128._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar128,auVar128);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar102._8_4_ = auVar34._8_4_;
    auVar102._12_4_ = auVar34._12_4_;
    auVar102._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar102,auVar102);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar88._8_4_ = auVar52._8_4_;
    auVar88._12_4_ = auVar52._12_4_;
    auVar88._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar88,auVar88);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar66._8_4_ = auVar67._8_4_;
    auVar66._12_4_ = auVar67._12_4_;
    auVar66._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar66,auVar66);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar51._8_4_ = auVar79._8_4_;
    auVar51._12_4_ = auVar79._12_4_;
    auVar51._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar51,auVar51);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar32._8_4_ = auVar89._8_4_;
    auVar32._12_4_ = auVar89._12_4_;
    auVar32._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar32,auVar32);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar13._8_4_ = auVar103._8_4_;
    auVar13._12_4_ = auVar103._12_4_;
    auVar13._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar13,auVar13);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar33._0_8_ = auVar116._8_8_;
    auVar33._8_4_ = auVar116._8_4_;
    auVar33._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar33,auVar33);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    goto LAB_0041630f;
  case 3:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar129._8_4_ = auVar14._8_4_;
    auVar129._12_4_ = auVar14._12_4_;
    auVar129._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar129,auVar129);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar117._8_4_ = auVar34._8_4_;
    auVar117._12_4_ = auVar34._12_4_;
    auVar117._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar117,auVar117);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar104._8_4_ = auVar52._8_4_;
    auVar104._12_4_ = auVar52._12_4_;
    auVar104._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar104,auVar104);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar80._8_4_ = auVar67._8_4_;
    auVar80._12_4_ = auVar67._12_4_;
    auVar80._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar80,auVar80);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar68._8_4_ = auVar79._8_4_;
    auVar68._12_4_ = auVar79._12_4_;
    auVar68._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar68,auVar68);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar53._8_4_ = auVar89._8_4_;
    auVar53._12_4_ = auVar89._12_4_;
    auVar53._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar53,auVar53);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar15._8_4_ = auVar103._8_4_;
    auVar15._12_4_ = auVar103._12_4_;
    auVar15._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar15,auVar15);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar35._8_4_ = auVar116._8_4_;
    auVar35._12_4_ = auVar116._12_4_;
    auVar35._0_8_ = auVar116._8_8_;
    auVar34 = pmovsxwd(auVar35,auVar35);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    break;
  case 4:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])(input + stride * 7);
    auVar34 = *(undefined1 (*) [16])(input + stride * 6);
    auVar52 = *(undefined1 (*) [16])(input + stride * 5);
    auVar67 = *(undefined1 (*) [16])(input + stride * 4);
    auVar79 = *(undefined1 (*) [16])(input + stride * 3);
    auVar89 = *(undefined1 (*) [16])(input + stride * 2);
    auVar103 = *(undefined1 (*) [16])(input + stride);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])input;
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar125._8_4_ = auVar14._8_4_;
    auVar125._12_4_ = auVar14._12_4_;
    auVar125._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar125,auVar125);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar113._8_4_ = auVar34._8_4_;
    auVar113._12_4_ = auVar34._12_4_;
    auVar113._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar113,auVar113);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar99._8_4_ = auVar52._8_4_;
    auVar99._12_4_ = auVar52._12_4_;
    auVar99._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar99,auVar99);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar76._8_4_ = auVar67._8_4_;
    auVar76._12_4_ = auVar67._12_4_;
    auVar76._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar76,auVar76);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar48._8_4_ = auVar79._8_4_;
    auVar48._12_4_ = auVar79._12_4_;
    auVar48._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar48,auVar48);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar28._8_4_ = auVar89._8_4_;
    auVar28._12_4_ = auVar89._12_4_;
    auVar28._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar28,auVar28);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar10._8_4_ = auVar103._8_4_;
    auVar10._12_4_ = auVar103._12_4_;
    auVar10._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar10,auVar10);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar29._0_8_ = auVar116._8_8_;
    auVar29._8_4_ = auVar116._8_4_;
    auVar29._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar29,auVar29);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
LAB_00415dc3:
    fadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    goto LAB_0041611e;
  case 5:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar67 = pshufb(*(undefined1 (*) [16])(input + stride * 4),_DAT_005616a0);
    auVar52 = pshufb(*(undefined1 (*) [16])(input + stride * 5),_DAT_005616a0);
    auVar14 = pshufb(*(undefined1 (*) [16])(input + stride * 6),_DAT_005616a0);
    auVar34 = pshufb(*(undefined1 (*) [16])(input + stride * 7),_DAT_005616a0);
    auVar79 = pshufb(*(undefined1 (*) [16])(input + stride * 3),_DAT_005616a0);
    auVar89 = pshufb(*(undefined1 (*) [16])(input + stride * 2),_DAT_005616a0);
    auVar103 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_005616a0);
    auVar116 = pshufb(*(undefined1 (*) [16])input,_DAT_005616a0);
    auVar135 = pmovsxwd(in_XMM9,auVar116);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar119._8_4_ = auVar116._8_4_;
    auVar119._12_4_ = auVar116._12_4_;
    auVar119._0_8_ = auVar116._8_8_;
    auVar116 = pmovsxwd(auVar119,auVar119);
    local_128[0]._0_4_ = auVar116._0_4_ << local_48;
    local_128[0]._4_4_ = auVar116._4_4_;
    local_128[1]._0_4_ = auVar116._8_4_;
    local_128[1]._4_4_ = auVar116._12_4_;
    auVar116 = pmovsxwd((undefined1  [16])local_128,auVar103);
    local_118._4_4_ = auVar116._4_4_;
    local_118._0_4_ = auVar116._0_4_ << local_48;
    local_118._8_4_ = auVar116._8_4_;
    local_118._12_4_ = auVar116._12_4_;
    auVar107._8_4_ = auVar103._8_4_;
    auVar107._12_4_ = auVar103._12_4_;
    auVar107._0_8_ = auVar103._8_8_;
    auVar103 = pmovsxwd(auVar107,auVar107);
    local_108._0_4_ = auVar103._0_4_ << local_48;
    local_108._4_4_ = auVar103._4_4_;
    local_108._8_4_ = auVar103._8_4_;
    local_108._12_4_ = auVar103._12_4_;
    auVar103 = pmovsxwd(local_108,auVar89);
    local_f8 = auVar103._0_4_ << local_48;
    iStack_f4 = auVar103._4_4_;
    iStack_f0 = auVar103._8_4_;
    iStack_ec = auVar103._12_4_;
    auVar92._8_4_ = auVar89._8_4_;
    auVar92._12_4_ = auVar89._12_4_;
    auVar92._0_8_ = auVar89._8_8_;
    auVar89 = pmovsxwd(auVar92,auVar92);
    local_e8._0_4_ = auVar89._0_4_ << local_48;
    local_e8._4_4_ = auVar89._4_4_;
    local_e8._8_4_ = auVar89._8_4_;
    local_e8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_e8,auVar79);
    local_d8._0_4_ = auVar89._0_4_ << local_48;
    local_d8._4_4_ = auVar89._4_4_;
    local_d8._8_4_ = auVar89._8_4_;
    local_d8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_d8,auVar67);
    auVar82._8_4_ = auVar79._8_4_;
    auVar82._12_4_ = auVar79._12_4_;
    auVar82._0_8_ = auVar79._8_8_;
    auVar79 = pmovsxwd(auVar82,auVar82);
    local_c8._4_4_ = auVar79._4_4_;
    local_c8._0_4_ = auVar79._0_4_ << local_48;
    local_c8._8_4_ = auVar79._8_4_;
    local_c8._12_4_ = auVar79._12_4_;
    _local_b8 = CONCAT44(auVar89._4_4_,auVar89._0_4_ << local_48);
    uStack_b0 = auVar89._8_8_;
    auVar71._8_4_ = auVar67._8_4_;
    auVar71._12_4_ = auVar67._12_4_;
    auVar71._0_8_ = auVar67._8_8_;
    auVar67 = pmovsxwd(auVar71,auVar71);
    local_a8._0_4_ = auVar67._0_4_ << local_48;
    local_a8._4_4_ = auVar67._4_4_;
    local_a8._8_4_ = auVar67._8_4_;
    local_a8._12_4_ = auVar67._12_4_;
    auVar67 = pmovsxwd(local_a8,auVar52);
    local_98._4_4_ = auVar67._4_4_;
    local_98._0_4_ = auVar67._0_4_ << local_48;
    local_98._8_4_ = auVar67._8_4_;
    local_98._12_4_ = auVar67._12_4_;
    auVar56._8_4_ = auVar52._8_4_;
    auVar56._12_4_ = auVar52._12_4_;
    auVar56._0_8_ = auVar52._8_8_;
    auVar52 = pmovsxwd(auVar56,auVar56);
    local_88._0_4_ = auVar52._0_4_ << local_48;
    local_88._4_4_ = auVar52._4_4_;
    local_88._8_4_ = auVar52._8_4_;
    local_88._12_4_ = auVar52._12_4_;
    auVar52 = pmovsxwd(local_88,auVar14);
    local_78 = auVar52._0_4_ << local_48;
    iStack_74 = auVar52._4_4_;
    iStack_70 = auVar52._8_4_;
    iStack_6c = auVar52._12_4_;
    auVar18._8_4_ = auVar14._8_4_;
    auVar18._12_4_ = auVar14._12_4_;
    auVar18._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar18,auVar18);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar34);
    auVar39._8_4_ = auVar34._8_4_;
    auVar39._12_4_ = auVar34._12_4_;
    auVar39._0_8_ = auVar34._8_8_;
    auVar34 = pmovsxwd(auVar39,auVar39);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
LAB_0041630f:
    fdct4x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1(&local_128,(__m128i *)&local_228,0xd,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    goto LAB_00417705;
  case 6:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar67 = pshufb(*(undefined1 (*) [16])(input + stride * 3),_DAT_005616a0);
    auVar52 = pshufb(*(undefined1 (*) [16])(input + stride * 2),_DAT_005616a0);
    auVar34 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_005616a0);
    auVar14 = pshufb(*(undefined1 (*) [16])input,_DAT_005616a0);
    auVar79 = pshufb(*(undefined1 (*) [16])(input + stride * 4),_DAT_005616a0);
    auVar89 = pshufb(*(undefined1 (*) [16])(input + stride * 5),_DAT_005616a0);
    auVar103 = pshufb(*(undefined1 (*) [16])(input + stride * 6),_DAT_005616a0);
    auVar116 = pshufb(*(undefined1 (*) [16])(input + stride * 7),_DAT_005616a0);
    auVar135 = pmovsxwd(in_XMM9,auVar116);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar132._8_4_ = auVar116._8_4_;
    auVar132._12_4_ = auVar116._12_4_;
    auVar132._0_8_ = auVar116._8_8_;
    auVar116 = pmovsxwd(auVar132,auVar132);
    local_128[0]._0_4_ = auVar116._0_4_ << local_48;
    local_128[0]._4_4_ = auVar116._4_4_;
    local_128[1]._0_4_ = auVar116._8_4_;
    local_128[1]._4_4_ = auVar116._12_4_;
    auVar116 = pmovsxwd((undefined1  [16])local_128,auVar103);
    local_118._4_4_ = auVar116._4_4_;
    local_118._0_4_ = auVar116._0_4_ << local_48;
    local_118._8_4_ = auVar116._8_4_;
    local_118._12_4_ = auVar116._12_4_;
    auVar109._8_4_ = auVar103._8_4_;
    auVar109._12_4_ = auVar103._12_4_;
    auVar109._0_8_ = auVar103._8_8_;
    auVar103 = pmovsxwd(auVar109,auVar109);
    local_108._0_4_ = auVar103._0_4_ << local_48;
    local_108._4_4_ = auVar103._4_4_;
    local_108._8_4_ = auVar103._8_4_;
    local_108._12_4_ = auVar103._12_4_;
    auVar103 = pmovsxwd(local_108,auVar89);
    local_f8 = auVar103._0_4_ << local_48;
    iStack_f4 = auVar103._4_4_;
    iStack_f0 = auVar103._8_4_;
    iStack_ec = auVar103._12_4_;
    auVar93._8_4_ = auVar89._8_4_;
    auVar93._12_4_ = auVar89._12_4_;
    auVar93._0_8_ = auVar89._8_8_;
    auVar89 = pmovsxwd(auVar93,auVar93);
    local_e8._0_4_ = auVar89._0_4_ << local_48;
    local_e8._4_4_ = auVar89._4_4_;
    local_e8._8_4_ = auVar89._8_4_;
    local_e8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_e8,auVar79);
    local_d8._0_4_ = auVar89._0_4_ << local_48;
    local_d8._4_4_ = auVar89._4_4_;
    local_d8._8_4_ = auVar89._8_4_;
    local_d8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_d8,auVar67);
    auVar84._8_4_ = auVar79._8_4_;
    auVar84._12_4_ = auVar79._12_4_;
    auVar84._0_8_ = auVar79._8_8_;
    auVar79 = pmovsxwd(auVar84,auVar84);
    local_c8._4_4_ = auVar79._4_4_;
    local_c8._0_4_ = auVar79._0_4_ << local_48;
    local_c8._8_4_ = auVar79._8_4_;
    local_c8._12_4_ = auVar79._12_4_;
    _local_b8 = CONCAT44(auVar89._4_4_,auVar89._0_4_ << local_48);
    uStack_b0 = auVar89._8_8_;
    auVar73._8_4_ = auVar67._8_4_;
    auVar73._12_4_ = auVar67._12_4_;
    auVar73._0_8_ = auVar67._8_8_;
    auVar67 = pmovsxwd(auVar73,auVar73);
    local_a8._0_4_ = auVar67._0_4_ << local_48;
    local_a8._4_4_ = auVar67._4_4_;
    local_a8._8_4_ = auVar67._8_4_;
    local_a8._12_4_ = auVar67._12_4_;
    auVar67 = pmovsxwd(local_a8,auVar52);
    local_98._4_4_ = auVar67._4_4_;
    local_98._0_4_ = auVar67._0_4_ << local_48;
    local_98._8_4_ = auVar67._8_4_;
    local_98._12_4_ = auVar67._12_4_;
    auVar58._8_4_ = auVar52._8_4_;
    auVar58._12_4_ = auVar52._12_4_;
    auVar58._0_8_ = auVar52._8_8_;
    auVar52 = pmovsxwd(auVar58,auVar58);
    local_88._0_4_ = auVar52._0_4_ << local_48;
    local_88._4_4_ = auVar52._4_4_;
    local_88._8_4_ = auVar52._8_4_;
    local_88._12_4_ = auVar52._12_4_;
    auVar52 = pmovsxwd(local_88,auVar34);
    local_78 = auVar52._0_4_ << local_48;
    iStack_74 = auVar52._4_4_;
    iStack_70 = auVar52._8_4_;
    iStack_6c = auVar52._12_4_;
    auVar41._8_4_ = auVar34._8_4_;
    auVar41._12_4_ = auVar34._12_4_;
    auVar41._0_8_ = auVar34._8_8_;
    auVar34 = pmovsxwd(auVar41,auVar41);
    local_68._0_4_ = auVar34._0_4_ << local_48;
    local_68._4_4_ = auVar34._4_4_;
    local_68._8_4_ = auVar34._8_4_;
    local_68._12_4_ = auVar34._12_4_;
    auVar34 = pmovsxwd(local_68,auVar14);
    auVar20._8_4_ = auVar14._8_4_;
    auVar20._12_4_ = auVar14._12_4_;
    auVar20._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar20,auVar20);
    local_58 = auVar34._0_4_ << local_48;
    uStack_54 = auVar34._4_4_;
    iStack_50 = auVar34._8_4_;
    iStack_4c = auVar34._12_4_;
    local_48 = auVar14._0_4_ << local_48;
    iStack_44 = auVar14._4_4_;
    iStack_40 = auVar14._8_4_;
    iStack_3c = auVar14._12_4_;
    break;
  case 7:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar67 = pshufb(*(undefined1 (*) [16])(input + stride * 4),_DAT_005616a0);
    auVar52 = pshufb(*(undefined1 (*) [16])(input + stride * 5),_DAT_005616a0);
    auVar14 = pshufb(*(undefined1 (*) [16])(input + stride * 6),_DAT_005616a0);
    auVar34 = pshufb(*(undefined1 (*) [16])(input + stride * 7),_DAT_005616a0);
    auVar79 = pshufb(*(undefined1 (*) [16])(input + stride * 3),_DAT_005616a0);
    auVar89 = pshufb(*(undefined1 (*) [16])(input + stride * 2),_DAT_005616a0);
    auVar103 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_005616a0);
    auVar116 = pshufb(*(undefined1 (*) [16])input,_DAT_005616a0);
    auVar135 = pmovsxwd(in_XMM9,auVar116);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar118._8_4_ = auVar116._8_4_;
    auVar118._12_4_ = auVar116._12_4_;
    auVar118._0_8_ = auVar116._8_8_;
    auVar116 = pmovsxwd(auVar118,auVar118);
    local_128[0]._0_4_ = auVar116._0_4_ << local_48;
    local_128[0]._4_4_ = auVar116._4_4_;
    local_128[1]._0_4_ = auVar116._8_4_;
    local_128[1]._4_4_ = auVar116._12_4_;
    auVar116 = pmovsxwd((undefined1  [16])local_128,auVar103);
    local_118._4_4_ = auVar116._4_4_;
    local_118._0_4_ = auVar116._0_4_ << local_48;
    local_118._8_4_ = auVar116._8_4_;
    local_118._12_4_ = auVar116._12_4_;
    auVar105._8_4_ = auVar103._8_4_;
    auVar105._12_4_ = auVar103._12_4_;
    auVar105._0_8_ = auVar103._8_8_;
    auVar103 = pmovsxwd(auVar105,auVar105);
    local_108._0_4_ = auVar103._0_4_ << local_48;
    local_108._4_4_ = auVar103._4_4_;
    local_108._8_4_ = auVar103._8_4_;
    local_108._12_4_ = auVar103._12_4_;
    auVar103 = pmovsxwd(local_108,auVar89);
    local_f8 = auVar103._0_4_ << local_48;
    iStack_f4 = auVar103._4_4_;
    iStack_f0 = auVar103._8_4_;
    iStack_ec = auVar103._12_4_;
    auVar90._8_4_ = auVar89._8_4_;
    auVar90._12_4_ = auVar89._12_4_;
    auVar90._0_8_ = auVar89._8_8_;
    auVar89 = pmovsxwd(auVar90,auVar90);
    local_e8._0_4_ = auVar89._0_4_ << local_48;
    local_e8._4_4_ = auVar89._4_4_;
    local_e8._8_4_ = auVar89._8_4_;
    local_e8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_e8,auVar79);
    local_d8._0_4_ = auVar89._0_4_ << local_48;
    local_d8._4_4_ = auVar89._4_4_;
    local_d8._8_4_ = auVar89._8_4_;
    local_d8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_d8,auVar67);
    auVar81._8_4_ = auVar79._8_4_;
    auVar81._12_4_ = auVar79._12_4_;
    auVar81._0_8_ = auVar79._8_8_;
    auVar79 = pmovsxwd(auVar81,auVar81);
    local_c8._4_4_ = auVar79._4_4_;
    local_c8._0_4_ = auVar79._0_4_ << local_48;
    local_c8._8_4_ = auVar79._8_4_;
    local_c8._12_4_ = auVar79._12_4_;
    _local_b8 = CONCAT44(auVar89._4_4_,auVar89._0_4_ << local_48);
    uStack_b0 = auVar89._8_8_;
    auVar69._8_4_ = auVar67._8_4_;
    auVar69._12_4_ = auVar67._12_4_;
    auVar69._0_8_ = auVar67._8_8_;
    auVar67 = pmovsxwd(auVar69,auVar69);
    local_a8._0_4_ = auVar67._0_4_ << local_48;
    local_a8._4_4_ = auVar67._4_4_;
    local_a8._8_4_ = auVar67._8_4_;
    local_a8._12_4_ = auVar67._12_4_;
    auVar67 = pmovsxwd(local_a8,auVar52);
    local_98._4_4_ = auVar67._4_4_;
    local_98._0_4_ = auVar67._0_4_ << local_48;
    local_98._8_4_ = auVar67._8_4_;
    local_98._12_4_ = auVar67._12_4_;
    auVar54._8_4_ = auVar52._8_4_;
    auVar54._12_4_ = auVar52._12_4_;
    auVar54._0_8_ = auVar52._8_8_;
    auVar52 = pmovsxwd(auVar54,auVar54);
    local_88._0_4_ = auVar52._0_4_ << local_48;
    local_88._4_4_ = auVar52._4_4_;
    local_88._8_4_ = auVar52._8_4_;
    local_88._12_4_ = auVar52._12_4_;
    auVar52 = pmovsxwd(local_88,auVar14);
    local_78 = auVar52._0_4_ << local_48;
    iStack_74 = auVar52._4_4_;
    iStack_70 = auVar52._8_4_;
    iStack_6c = auVar52._12_4_;
    auVar16._8_4_ = auVar14._8_4_;
    auVar16._12_4_ = auVar14._12_4_;
    auVar16._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar16,auVar16);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar34);
    auVar36._8_4_ = auVar34._8_4_;
    auVar36._12_4_ = auVar34._12_4_;
    auVar36._0_8_ = auVar34._8_8_;
    auVar34 = pmovsxwd(auVar36,auVar36);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    break;
  case 8:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])(input + stride * 7);
    auVar34 = *(undefined1 (*) [16])(input + stride * 6);
    auVar52 = *(undefined1 (*) [16])(input + stride * 5);
    auVar67 = *(undefined1 (*) [16])(input + stride * 4);
    auVar79 = *(undefined1 (*) [16])(input + stride * 3);
    auVar89 = *(undefined1 (*) [16])(input + stride * 2);
    auVar103 = *(undefined1 (*) [16])(input + stride);
    auVar116 = *(undefined1 (*) [16])input;
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar134._8_4_ = auVar14._8_4_;
    auVar134._12_4_ = auVar14._12_4_;
    auVar134._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar134,auVar134);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar121._8_4_ = auVar34._8_4_;
    auVar121._12_4_ = auVar34._12_4_;
    auVar121._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar121,auVar121);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar111._8_4_ = auVar52._8_4_;
    auVar111._12_4_ = auVar52._12_4_;
    auVar111._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar111,auVar111);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar95._8_4_ = auVar67._8_4_;
    auVar95._12_4_ = auVar67._12_4_;
    auVar95._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar95,auVar95);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar75._8_4_ = auVar79._8_4_;
    auVar75._12_4_ = auVar79._12_4_;
    auVar75._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar75,auVar75);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar60._8_4_ = auVar89._8_4_;
    auVar60._12_4_ = auVar89._12_4_;
    auVar60._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar60,auVar60);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar44._8_4_ = auVar103._8_4_;
    auVar44._12_4_ = auVar103._12_4_;
    auVar44._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar44,auVar44);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_68,auVar116);
    auVar22._8_4_ = auVar116._8_4_;
    auVar22._12_4_ = auVar116._12_4_;
    auVar22._0_8_ = auVar116._8_8_;
    auVar14 = pmovsxwd(auVar22,auVar22);
    local_58 = auVar34._0_4_ << local_48;
    uStack_54 = auVar34._4_4_;
    iStack_50 = auVar34._8_4_;
    iStack_4c = auVar34._12_4_;
    local_48 = auVar14._0_4_ << local_48;
    iStack_44 = auVar14._4_4_;
    iStack_40 = auVar14._8_4_;
    iStack_3c = auVar14._12_4_;
    break;
  case 9:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar127._8_4_ = auVar14._8_4_;
    auVar127._12_4_ = auVar14._12_4_;
    auVar127._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar127,auVar127);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._4_4_ = auVar14._4_4_;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar135 = pmovsxwd(local_118,auVar52);
    auVar115._8_4_ = auVar34._8_4_;
    auVar115._12_4_ = auVar34._12_4_;
    auVar115._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar115,auVar115);
    local_f8 = auVar135._0_4_ << local_48;
    iStack_f4 = auVar135._4_4_;
    iStack_f0 = auVar135._8_4_;
    iStack_ec = auVar135._12_4_;
    local_108._4_4_ = auVar14._4_4_;
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar101._8_4_ = auVar52._8_4_;
    auVar101._12_4_ = auVar52._12_4_;
    auVar101._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar101,auVar101);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar78._8_4_ = auVar67._8_4_;
    auVar78._12_4_ = auVar67._12_4_;
    auVar78._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar78,auVar78);
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_c8,auVar79);
    _local_b8 = CONCAT44(auVar14._4_4_,auVar14._0_4_ << local_48);
    uStack_b0 = auVar14._8_8_;
    auVar65._8_4_ = auVar79._8_4_;
    auVar65._12_4_ = auVar79._12_4_;
    auVar65._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar65,auVar65);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_a8,auVar89);
    auVar50._8_4_ = auVar89._8_4_;
    auVar50._12_4_ = auVar89._12_4_;
    auVar50._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar50,auVar50);
    local_98._0_4_ = auVar34._0_4_ << local_48;
    local_98._4_4_ = auVar34._4_4_;
    local_98._8_4_ = auVar34._8_4_;
    local_98._12_4_ = auVar34._12_4_;
    auVar34 = pmovsxwd(local_98,auVar103);
    local_78 = auVar34._0_4_ << local_48;
    iStack_74 = auVar34._4_4_;
    iStack_70 = auVar34._8_4_;
    iStack_6c = auVar34._12_4_;
    local_88._4_4_ = auVar14._4_4_;
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar31._8_4_ = auVar103._8_4_;
    auVar31._12_4_ = auVar103._12_4_;
    auVar31._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar31,auVar31);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    auVar12._8_4_ = auVar116._8_4_;
    auVar12._12_4_ = auVar116._12_4_;
    auVar12._0_8_ = auVar116._8_8_;
    auVar14 = pmovsxwd(auVar12,auVar12);
    local_48 = auVar14._0_4_ << local_48;
    iStack_44 = auVar14._4_4_;
    iStack_40 = auVar14._8_4_;
    iStack_3c = auVar14._12_4_;
    idtx8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,stride,2);
    goto LAB_0041523a;
  case 10:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar133._8_4_ = auVar14._8_4_;
    auVar133._12_4_ = auVar14._12_4_;
    auVar133._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar133,auVar133);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar110._8_4_ = auVar34._8_4_;
    auVar110._12_4_ = auVar34._12_4_;
    auVar110._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar110,auVar110);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar94._8_4_ = auVar52._8_4_;
    auVar94._12_4_ = auVar52._12_4_;
    auVar94._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar94,auVar94);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar74._8_4_ = auVar67._8_4_;
    auVar74._12_4_ = auVar67._12_4_;
    auVar74._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar74,auVar74);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar59._8_4_ = auVar79._8_4_;
    auVar59._12_4_ = auVar79._12_4_;
    auVar59._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar59,auVar59);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar42._8_4_ = auVar89._8_4_;
    auVar42._12_4_ = auVar89._12_4_;
    auVar42._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar42,auVar42);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar21._8_4_ = auVar103._8_4_;
    auVar21._12_4_ = auVar103._12_4_;
    auVar21._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar21,auVar21);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar43._0_8_ = auVar116._8_8_;
    auVar43._8_4_ = auVar116._8_4_;
    auVar43._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar43,auVar43);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    fdct4x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1(&local_128,(__m128i *)&local_228,0xd,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    goto LAB_00417213;
  case 0xb:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar124._8_4_ = auVar14._8_4_;
    auVar124._12_4_ = auVar14._12_4_;
    auVar124._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar124,auVar124);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar98._8_4_ = auVar34._8_4_;
    auVar98._12_4_ = auVar34._12_4_;
    auVar98._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar98,auVar98);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar87._8_4_ = auVar52._8_4_;
    auVar87._12_4_ = auVar52._12_4_;
    auVar87._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar87,auVar87);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar63._8_4_ = auVar67._8_4_;
    auVar63._12_4_ = auVar67._12_4_;
    auVar63._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar63,auVar63);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar47._8_4_ = auVar79._8_4_;
    auVar47._12_4_ = auVar79._12_4_;
    auVar47._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar47,auVar47);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar26._8_4_ = auVar89._8_4_;
    auVar26._12_4_ = auVar89._12_4_;
    auVar26._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar26,auVar26);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar9._8_4_ = auVar103._8_4_;
    auVar9._12_4_ = auVar103._12_4_;
    auVar9._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar9,auVar9);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar27._0_8_ = auVar116._8_8_;
    auVar27._8_4_ = auVar116._8_4_;
    auVar27._12_4_ = auVar116._12_4_;
    auVar34 = pmovsxwd(auVar27,auVar27);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    idtx8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,stride,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
LAB_0041611e:
    iStack_21c = iStack_50;
    iStack_1fc = iStack_4c;
    iStack_1f0 = iStack_f0;
    iStack_1e0 = iStack_70;
    iStack_1dc = local_48;
    iStack_1d0 = iStack_ec;
    iStack_1c0 = iStack_6c;
    iStack_1bc = iStack_44;
    iStack_19c = iStack_40;
    iStack_17c = iStack_3c;
    iStack_174 = local_f8;
    iStack_164 = local_78;
    iStack_15c = iStack_38;
    iStack_154 = iStack_f4;
    iStack_144 = iStack_74;
    iStack_13c = iStack_34;
    fdct4x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1(&local_128,(__m128i *)&local_228,0xd,2);
    goto LAB_0041770f;
  case 0xc:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar126._8_4_ = auVar14._8_4_;
    auVar126._12_4_ = auVar14._12_4_;
    auVar126._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar126,auVar126);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar114._8_4_ = auVar34._8_4_;
    auVar114._12_4_ = auVar34._12_4_;
    auVar114._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar114,auVar114);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar100._8_4_ = auVar52._8_4_;
    auVar100._12_4_ = auVar52._12_4_;
    auVar100._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar100,auVar100);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar77._8_4_ = auVar67._8_4_;
    auVar77._12_4_ = auVar67._12_4_;
    auVar77._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar77,auVar77);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar64._8_4_ = auVar79._8_4_;
    auVar64._12_4_ = auVar79._12_4_;
    auVar64._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar64,auVar64);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar49._8_4_ = auVar89._8_4_;
    auVar49._12_4_ = auVar89._12_4_;
    auVar49._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar49,auVar49);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar11._8_4_ = auVar103._8_4_;
    auVar11._12_4_ = auVar103._12_4_;
    auVar11._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar11,auVar11);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar30._8_4_ = auVar116._8_4_;
    auVar30._12_4_ = auVar116._12_4_;
    auVar30._0_8_ = auVar116._8_8_;
    auVar34 = pmovsxwd(auVar30,auVar30);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    goto LAB_0041505e;
  case 0xd:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])input;
    auVar34 = *(undefined1 (*) [16])(input + stride);
    auVar52 = *(undefined1 (*) [16])(input + stride * 2);
    auVar67 = *(undefined1 (*) [16])(input + stride * 3);
    auVar79 = *(undefined1 (*) [16])(input + stride * 4);
    auVar89 = *(undefined1 (*) [16])(input + stride * 5);
    auVar103 = *(undefined1 (*) [16])(input + stride * 6);
    auVar116 = *(undefined1 (*) [16])(input + stride * 7);
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar131._8_4_ = auVar14._8_4_;
    auVar131._12_4_ = auVar14._12_4_;
    auVar131._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar131,auVar131);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar120._8_4_ = auVar34._8_4_;
    auVar120._12_4_ = auVar34._12_4_;
    auVar120._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar120,auVar120);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar108._8_4_ = auVar52._8_4_;
    auVar108._12_4_ = auVar52._12_4_;
    auVar108._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar108,auVar108);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar83._8_4_ = auVar67._8_4_;
    auVar83._12_4_ = auVar67._12_4_;
    auVar83._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar83,auVar83);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar72._8_4_ = auVar79._8_4_;
    auVar72._12_4_ = auVar79._12_4_;
    auVar72._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar72,auVar72);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar57._8_4_ = auVar89._8_4_;
    auVar57._12_4_ = auVar89._12_4_;
    auVar57._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar57,auVar57);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar19._8_4_ = auVar103._8_4_;
    auVar19._12_4_ = auVar103._12_4_;
    auVar19._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar19,auVar19);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar116);
    auVar40._8_4_ = auVar116._8_4_;
    auVar40._12_4_ = auVar116._12_4_;
    auVar40._0_8_ = auVar116._8_8_;
    auVar34 = pmovsxwd(auVar40,auVar40);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
    goto LAB_00416810;
  case 0xe:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar14 = *(undefined1 (*) [16])(input + stride * 7);
    auVar34 = *(undefined1 (*) [16])(input + stride * 6);
    auVar52 = *(undefined1 (*) [16])(input + stride * 5);
    auVar67 = *(undefined1 (*) [16])(input + stride * 4);
    auVar79 = *(undefined1 (*) [16])(input + stride * 3);
    auVar89 = *(undefined1 (*) [16])(input + stride * 2);
    auVar103 = *(undefined1 (*) [16])(input + stride);
    auVar116 = *(undefined1 (*) [16])input;
    auVar135 = pmovsxwd(in_XMM9,auVar14);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar123._8_4_ = auVar14._8_4_;
    auVar123._12_4_ = auVar14._12_4_;
    auVar123._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar123,auVar123);
    local_128[0]._0_4_ = auVar14._0_4_ << local_48;
    local_128[0]._4_4_ = auVar14._4_4_;
    local_128[1]._0_4_ = auVar14._8_4_;
    local_128[1]._4_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd((undefined1  [16])local_128,auVar34);
    local_118._4_4_ = auVar14._4_4_;
    local_118._0_4_ = auVar14._0_4_ << local_48;
    local_118._8_4_ = auVar14._8_4_;
    local_118._12_4_ = auVar14._12_4_;
    auVar112._8_4_ = auVar34._8_4_;
    auVar112._12_4_ = auVar34._12_4_;
    auVar112._0_8_ = auVar34._8_8_;
    auVar14 = pmovsxwd(auVar112,auVar112);
    local_108._0_4_ = auVar14._0_4_ << local_48;
    local_108._4_4_ = auVar14._4_4_;
    local_108._8_4_ = auVar14._8_4_;
    local_108._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_108,auVar52);
    local_f8 = auVar14._0_4_ << local_48;
    iStack_f4 = auVar14._4_4_;
    iStack_f0 = auVar14._8_4_;
    iStack_ec = auVar14._12_4_;
    auVar97._8_4_ = auVar52._8_4_;
    auVar97._12_4_ = auVar52._12_4_;
    auVar97._0_8_ = auVar52._8_8_;
    auVar14 = pmovsxwd(auVar97,auVar97);
    local_e8._0_4_ = auVar14._0_4_ << local_48;
    local_e8._4_4_ = auVar14._4_4_;
    local_e8._8_4_ = auVar14._8_4_;
    local_e8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_e8,auVar67);
    local_d8._0_4_ = auVar14._0_4_ << local_48;
    local_d8._4_4_ = auVar14._4_4_;
    local_d8._8_4_ = auVar14._8_4_;
    local_d8._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_d8,auVar79);
    auVar86._8_4_ = auVar67._8_4_;
    auVar86._12_4_ = auVar67._12_4_;
    auVar86._0_8_ = auVar67._8_8_;
    auVar14 = pmovsxwd(auVar86,auVar86);
    local_c8._4_4_ = auVar14._4_4_;
    local_c8._0_4_ = auVar14._0_4_ << local_48;
    local_c8._8_4_ = auVar14._8_4_;
    local_c8._12_4_ = auVar14._12_4_;
    _local_b8 = CONCAT44(auVar34._4_4_,auVar34._0_4_ << local_48);
    uStack_b0 = auVar34._8_8_;
    auVar62._8_4_ = auVar79._8_4_;
    auVar62._12_4_ = auVar79._12_4_;
    auVar62._0_8_ = auVar79._8_8_;
    auVar14 = pmovsxwd(auVar62,auVar62);
    local_a8._0_4_ = auVar14._0_4_ << local_48;
    local_a8._4_4_ = auVar14._4_4_;
    local_a8._8_4_ = auVar14._8_4_;
    local_a8._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_a8,auVar89);
    local_98._4_4_ = auVar14._4_4_;
    local_98._0_4_ = auVar14._0_4_ << local_48;
    local_98._8_4_ = auVar14._8_4_;
    local_98._12_4_ = auVar14._12_4_;
    auVar46._8_4_ = auVar89._8_4_;
    auVar46._12_4_ = auVar89._12_4_;
    auVar46._0_8_ = auVar89._8_8_;
    auVar14 = pmovsxwd(auVar46,auVar46);
    local_88._0_4_ = auVar14._0_4_ << local_48;
    local_88._4_4_ = auVar14._4_4_;
    local_88._8_4_ = auVar14._8_4_;
    local_88._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_88,auVar103);
    local_78 = auVar14._0_4_ << local_48;
    iStack_74 = auVar14._4_4_;
    iStack_70 = auVar14._8_4_;
    iStack_6c = auVar14._12_4_;
    auVar25._8_4_ = auVar103._8_4_;
    auVar25._12_4_ = auVar103._12_4_;
    auVar25._0_8_ = auVar103._8_8_;
    auVar14 = pmovsxwd(auVar25,auVar25);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar34 = pmovsxwd(local_68,auVar116);
    auVar135._8_4_ = auVar116._8_4_;
    auVar135._12_4_ = auVar116._12_4_;
    auVar135._0_8_ = auVar116._8_8_;
    auVar14 = pmovsxwd(auVar135,auVar135);
    local_58 = auVar34._0_4_ << local_48;
    uStack_54 = auVar34._4_4_;
    iStack_50 = auVar34._8_4_;
    iStack_4c = auVar34._12_4_;
    local_48 = auVar14._0_4_ << local_48;
    iStack_44 = auVar14._4_4_;
    iStack_40 = auVar14._8_4_;
    iStack_3c = auVar14._12_4_;
LAB_0041505e:
    fadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
LAB_0041523a:
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
LAB_00417213:
    iStack_21c = iStack_50;
    iStack_1fc = iStack_4c;
    iStack_1f0 = iStack_f0;
    iStack_1e0 = iStack_70;
    iStack_1dc = local_48;
    iStack_1d0 = iStack_ec;
    iStack_1c0 = iStack_6c;
    iStack_1bc = iStack_44;
    iStack_19c = iStack_40;
    iStack_17c = iStack_3c;
    iStack_174 = local_f8;
    iStack_164 = local_78;
    iStack_15c = iStack_38;
    iStack_154 = iStack_f4;
    iStack_144 = iStack_74;
    iStack_13c = iStack_34;
    idtx8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,iVar6,2);
    goto LAB_0041770f;
  case 0xf:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    lVar5 = (long)stride;
    iVar3 = stride * 2;
    iVar6 = stride * 3;
    iVar7 = stride * 4;
    iVar1 = stride * 5;
    iVar2 = stride * 6;
    stride = stride * 7;
    auVar67 = pshufb(*(undefined1 (*) [16])(input + iVar7),_DAT_005616a0);
    auVar52 = pshufb(*(undefined1 (*) [16])(input + iVar1),_DAT_005616a0);
    auVar14 = pshufb(*(undefined1 (*) [16])(input + iVar2),_DAT_005616a0);
    auVar34 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_005616a0);
    auVar79 = pshufb(*(undefined1 (*) [16])(input + iVar6),_DAT_005616a0);
    auVar89 = pshufb(*(undefined1 (*) [16])(input + iVar3),_DAT_005616a0);
    auVar103 = pshufb(*(undefined1 (*) [16])(input + lVar5),_DAT_005616a0);
    auVar116 = pshufb(*(undefined1 (*) [16])input,_DAT_005616a0);
    auVar135 = pmovsxwd(in_XMM9,auVar116);
    local_138 = CONCAT44(auVar135._4_4_,auVar135._0_4_ << local_48);
    lStack_130 = auVar135._8_8_;
    auVar116._0_8_ = auVar116._8_8_;
    auVar116 = pmovsxwd(auVar116,auVar116);
    local_128[0]._0_4_ = auVar116._0_4_ << local_48;
    local_128[0]._4_4_ = auVar116._4_4_;
    local_128[1]._0_4_ = auVar116._8_4_;
    local_128[1]._4_4_ = auVar116._12_4_;
    auVar116 = pmovsxwd((undefined1  [16])local_128,auVar103);
    local_118._4_4_ = auVar116._4_4_;
    local_118._0_4_ = auVar116._0_4_ << local_48;
    local_118._8_4_ = auVar116._8_4_;
    local_118._12_4_ = auVar116._12_4_;
    auVar103._0_8_ = auVar103._8_8_;
    auVar103 = pmovsxwd(auVar103,auVar103);
    local_108._0_4_ = auVar103._0_4_ << local_48;
    local_108._4_4_ = auVar103._4_4_;
    local_108._8_4_ = auVar103._8_4_;
    local_108._12_4_ = auVar103._12_4_;
    auVar103 = pmovsxwd(local_108,auVar89);
    local_f8 = auVar103._0_4_ << local_48;
    iStack_f4 = auVar103._4_4_;
    iStack_f0 = auVar103._8_4_;
    iStack_ec = auVar103._12_4_;
    auVar89._0_8_ = auVar89._8_8_;
    auVar89 = pmovsxwd(auVar89,auVar89);
    local_e8._0_4_ = auVar89._0_4_ << local_48;
    local_e8._4_4_ = auVar89._4_4_;
    local_e8._8_4_ = auVar89._8_4_;
    local_e8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_e8,auVar79);
    local_d8._0_4_ = auVar89._0_4_ << local_48;
    local_d8._4_4_ = auVar89._4_4_;
    local_d8._8_4_ = auVar89._8_4_;
    local_d8._12_4_ = auVar89._12_4_;
    auVar89 = pmovsxwd(local_d8,auVar67);
    auVar79._0_8_ = auVar79._8_8_;
    auVar79 = pmovsxwd(auVar79,auVar79);
    local_c8._4_4_ = auVar79._4_4_;
    local_c8._0_4_ = auVar79._0_4_ << local_48;
    local_c8._8_4_ = auVar79._8_4_;
    local_c8._12_4_ = auVar79._12_4_;
    _local_b8 = CONCAT44(auVar89._4_4_,auVar89._0_4_ << local_48);
    uStack_b0 = auVar89._8_8_;
    auVar67._0_8_ = auVar67._8_8_;
    auVar67 = pmovsxwd(auVar67,auVar67);
    local_a8._0_4_ = auVar67._0_4_ << local_48;
    local_a8._4_4_ = auVar67._4_4_;
    local_a8._8_4_ = auVar67._8_4_;
    local_a8._12_4_ = auVar67._12_4_;
    auVar67 = pmovsxwd(local_a8,auVar52);
    local_98._4_4_ = auVar67._4_4_;
    local_98._0_4_ = auVar67._0_4_ << local_48;
    local_98._8_4_ = auVar67._8_4_;
    local_98._12_4_ = auVar67._12_4_;
    auVar52._0_8_ = auVar52._8_8_;
    auVar52 = pmovsxwd(auVar52,auVar52);
    local_88._0_4_ = auVar52._0_4_ << local_48;
    local_88._4_4_ = auVar52._4_4_;
    local_88._8_4_ = auVar52._8_4_;
    local_88._12_4_ = auVar52._12_4_;
    auVar52 = pmovsxwd(local_88,auVar14);
    local_78 = auVar52._0_4_ << local_48;
    iStack_74 = auVar52._4_4_;
    iStack_70 = auVar52._8_4_;
    iStack_6c = auVar52._12_4_;
    auVar14._0_8_ = auVar14._8_8_;
    auVar14 = pmovsxwd(auVar14,auVar14);
    local_68._0_4_ = auVar14._0_4_ << local_48;
    local_68._4_4_ = auVar14._4_4_;
    local_68._8_4_ = auVar14._8_4_;
    local_68._12_4_ = auVar14._12_4_;
    auVar14 = pmovsxwd(local_68,auVar34);
    auVar34._0_8_ = auVar34._8_8_;
    auVar34 = pmovsxwd(auVar34,auVar34);
    local_58 = auVar14._0_4_ << local_48;
    uStack_54 = auVar14._4_4_;
    iStack_50 = auVar14._8_4_;
    iStack_4c = auVar14._12_4_;
    local_48 = auVar34._0_4_ << local_48;
    iStack_44 = auVar34._4_4_;
    iStack_40 = auVar34._8_4_;
    iStack_3c = auVar34._12_4_;
LAB_00416810:
    idtx8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,stride,2);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar14 = ZEXT416((uint)-(int)piVar4[1]);
    local_238 = local_238 + iVar6 >> auVar14;
    iStack_234 = iStack_234 + iVar6 >> auVar14;
    iStack_230 = iStack_230 + iVar6 >> auVar14;
    iStack_22c = iStack_22c + iVar6 >> auVar14;
    local_228 = local_228 + iVar6 >> auVar14;
    iStack_224 = iStack_224 + iVar6 >> auVar14;
    iStack_220 = iStack_220 + iVar6 >> auVar14;
    iStack_50 = iStack_21c + iVar6 >> auVar14;
    local_218 = local_218 + iVar6 >> auVar14;
    iStack_214 = iStack_214 + iVar6 >> auVar14;
    iStack_210 = iStack_210 + iVar6 >> auVar14;
    iStack_20c = iStack_20c + iVar6 >> auVar14;
    local_208 = local_208 + iVar6 >> auVar14;
    iStack_204 = iStack_204 + iVar6 >> auVar14;
    iStack_200 = iStack_200 + iVar6 >> auVar14;
    iStack_4c = iStack_1fc + iVar6 >> auVar14;
    local_1f8 = local_1f8 + iVar6 >> auVar14;
    iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
    iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
    iStack_1ec = iStack_1ec + iVar6 >> auVar14;
    local_1e8 = local_1e8 + iVar6 >> auVar14;
    iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
    iStack_70 = iStack_1e0 + iVar6 >> auVar14;
    local_48 = iStack_1dc + iVar6 >> auVar14;
    local_1d8 = local_1d8 + iVar6 >> auVar14;
    iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
    iStack_ec = iStack_1d0 + iVar6 >> auVar14;
    iStack_1cc = iStack_1cc + iVar6 >> auVar14;
    local_1c8 = local_1c8 + iVar6 >> auVar14;
    iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
    iStack_6c = iStack_1c0 + iVar6 >> auVar14;
    iStack_44 = iStack_1bc + iVar6 >> auVar14;
    local_1b8 = local_1b8 + iVar6 >> auVar14;
    iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
    iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
    iStack_1ac = iStack_1ac + iVar6 >> auVar14;
    local_1a8 = local_1a8 + iVar6 >> auVar14;
    iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
    iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
    iStack_40 = iStack_19c + iVar6 >> auVar14;
    local_198 = local_198 + iVar6 >> auVar14;
    iStack_194 = iStack_194 + iVar6 >> auVar14;
    iStack_190 = iStack_190 + iVar6 >> auVar14;
    iStack_18c = iStack_18c + iVar6 >> auVar14;
    local_188 = local_188 + iVar6 >> auVar14;
    iStack_184 = iStack_184 + iVar6 >> auVar14;
    iStack_180 = iStack_180 + iVar6 >> auVar14;
    iStack_3c = iStack_17c + iVar6 >> auVar14;
    local_178 = local_178 + iVar6 >> auVar14;
    local_f8 = iStack_174 + iVar6 >> auVar14;
    iStack_170 = iStack_170 + iVar6 >> auVar14;
    iStack_16c = iStack_16c + iVar6 >> auVar14;
    local_168 = local_168 + iVar6 >> auVar14;
    local_78 = iStack_164 + iVar6 >> auVar14;
    iStack_160 = iStack_160 + iVar6 >> auVar14;
    iStack_38 = iStack_15c + iVar6 >> auVar14;
    local_158 = local_158 + iVar6 >> auVar14;
    iStack_f4 = iStack_154 + iVar6 >> auVar14;
    iStack_150 = iStack_150 + iVar6 >> auVar14;
    iStack_14c = iStack_14c + iVar6 >> auVar14;
    local_148 = iVar6 + local_148 >> auVar14;
    iStack_74 = iVar6 + iStack_144 >> auVar14;
    iStack_140 = iVar6 + iStack_140 >> auVar14;
    iStack_34 = iVar6 + iStack_13c >> auVar14;
    local_138 = CONCAT44(local_218,local_238);
    lStack_130 = CONCAT44(local_1d8,local_1f8);
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0 = CONCAT44(local_1c8,local_1e8);
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    local_128[0]._4_4_ = local_198;
    local_128[0]._0_4_ = local_1b8;
    local_128[1]._4_4_ = local_158;
    local_128[1]._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    _local_b8 = CONCAT44(iStack_14c,iStack_16c);
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    goto LAB_00417705;
  default:
    goto switchD_004141ac_default;
  }
  fadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
  iVar6 = 1 << (~piVar4[1] & 0x1fU);
  auVar14 = ZEXT416((uint)-(int)piVar4[1]);
  local_238 = local_238 + iVar6 >> auVar14;
  iStack_234 = iStack_234 + iVar6 >> auVar14;
  iStack_230 = iStack_230 + iVar6 >> auVar14;
  iStack_22c = iStack_22c + iVar6 >> auVar14;
  local_228 = local_228 + iVar6 >> auVar14;
  iStack_224 = iStack_224 + iVar6 >> auVar14;
  iStack_220 = iStack_220 + iVar6 >> auVar14;
  iStack_50 = iStack_21c + iVar6 >> auVar14;
  local_218 = local_218 + iVar6 >> auVar14;
  iStack_214 = iStack_214 + iVar6 >> auVar14;
  iStack_210 = iStack_210 + iVar6 >> auVar14;
  iStack_20c = iStack_20c + iVar6 >> auVar14;
  local_208 = local_208 + iVar6 >> auVar14;
  iStack_204 = iStack_204 + iVar6 >> auVar14;
  iStack_200 = iStack_200 + iVar6 >> auVar14;
  iStack_4c = iStack_1fc + iVar6 >> auVar14;
  local_1f8 = local_1f8 + iVar6 >> auVar14;
  iStack_1f4 = iStack_1f4 + iVar6 >> auVar14;
  iStack_f0 = iStack_1f0 + iVar6 >> auVar14;
  iStack_1ec = iStack_1ec + iVar6 >> auVar14;
  local_1e8 = local_1e8 + iVar6 >> auVar14;
  iStack_1e4 = iStack_1e4 + iVar6 >> auVar14;
  iStack_70 = iStack_1e0 + iVar6 >> auVar14;
  local_48 = iStack_1dc + iVar6 >> auVar14;
  local_1d8 = local_1d8 + iVar6 >> auVar14;
  iStack_1d4 = iStack_1d4 + iVar6 >> auVar14;
  iStack_ec = iStack_1d0 + iVar6 >> auVar14;
  iStack_1cc = iStack_1cc + iVar6 >> auVar14;
  local_1c8 = local_1c8 + iVar6 >> auVar14;
  iStack_1c4 = iStack_1c4 + iVar6 >> auVar14;
  iStack_6c = iStack_1c0 + iVar6 >> auVar14;
  iStack_44 = iStack_1bc + iVar6 >> auVar14;
  local_1b8 = local_1b8 + iVar6 >> auVar14;
  iStack_1b4 = iStack_1b4 + iVar6 >> auVar14;
  iStack_1b0 = iStack_1b0 + iVar6 >> auVar14;
  iStack_1ac = iStack_1ac + iVar6 >> auVar14;
  local_1a8 = local_1a8 + iVar6 >> auVar14;
  iStack_1a4 = iStack_1a4 + iVar6 >> auVar14;
  iStack_1a0 = iStack_1a0 + iVar6 >> auVar14;
  iStack_40 = iStack_19c + iVar6 >> auVar14;
  local_198 = local_198 + iVar6 >> auVar14;
  iStack_194 = iStack_194 + iVar6 >> auVar14;
  iStack_190 = iStack_190 + iVar6 >> auVar14;
  iStack_18c = iStack_18c + iVar6 >> auVar14;
  local_188 = local_188 + iVar6 >> auVar14;
  iStack_184 = iStack_184 + iVar6 >> auVar14;
  iStack_180 = iStack_180 + iVar6 >> auVar14;
  iStack_3c = iStack_17c + iVar6 >> auVar14;
  local_178 = local_178 + iVar6 >> auVar14;
  local_f8 = iStack_174 + iVar6 >> auVar14;
  iStack_170 = iStack_170 + iVar6 >> auVar14;
  iStack_16c = iStack_16c + iVar6 >> auVar14;
  local_168 = local_168 + iVar6 >> auVar14;
  local_78 = iStack_164 + iVar6 >> auVar14;
  iStack_160 = iStack_160 + iVar6 >> auVar14;
  iStack_38 = iStack_15c + iVar6 >> auVar14;
  local_158 = local_158 + iVar6 >> auVar14;
  iStack_f4 = iStack_154 + iVar6 >> auVar14;
  iStack_150 = iStack_150 + iVar6 >> auVar14;
  iStack_14c = iStack_14c + iVar6 >> auVar14;
  local_148 = iVar6 + local_148 >> auVar14;
  iStack_74 = iVar6 + iStack_144 >> auVar14;
  iStack_140 = iVar6 + iStack_140 >> auVar14;
  iStack_34 = iVar6 + iStack_13c >> auVar14;
  local_138 = CONCAT44(local_218,local_238);
  lStack_130 = CONCAT44(local_1d8,local_1f8);
  local_118._8_4_ = iStack_234;
  local_118._12_4_ = iStack_214;
  local_108._4_4_ = iStack_1d4;
  local_108._0_4_ = iStack_1f4;
  local_d8._8_4_ = iStack_22c;
  local_d8._12_4_ = iStack_20c;
  local_c8._4_4_ = iStack_1cc;
  local_c8._0_4_ = iStack_1ec;
  uStack_b0 = CONCAT44(local_1c8,local_1e8);
  local_98._8_4_ = iStack_224;
  local_98._12_4_ = iStack_204;
  local_88._4_4_ = iStack_1c4;
  local_88._0_4_ = iStack_1e4;
  local_128[0]._4_4_ = local_198;
  local_128[0]._0_4_ = local_1b8;
  local_128[1]._4_4_ = local_158;
  local_128[1]._0_4_ = local_178;
  local_108._8_4_ = iStack_1b4;
  local_108._12_4_ = iStack_194;
  local_e8._4_4_ = iStack_190;
  local_e8._0_4_ = iStack_1b0;
  local_e8._8_4_ = iStack_170;
  local_e8._12_4_ = iStack_150;
  local_c8._8_4_ = iStack_1ac;
  local_c8._12_4_ = iStack_18c;
  _local_b8 = CONCAT44(iStack_14c,iStack_16c);
  local_a8._4_4_ = local_188;
  local_a8._0_4_ = local_1a8;
  local_a8._12_4_ = local_148;
  local_a8._8_4_ = local_168;
  local_88._8_4_ = iStack_1a4;
  local_88._12_4_ = iStack_184;
  local_68._4_4_ = iStack_180;
  local_68._0_4_ = iStack_1a0;
  local_68._8_4_ = iStack_160;
  local_68._12_4_ = iStack_140;
LAB_00417705:
  iStack_21c = iStack_50;
  iStack_1fc = iStack_4c;
  iStack_1f0 = iStack_f0;
  iStack_1e0 = iStack_70;
  iStack_1dc = local_48;
  iStack_1d0 = iStack_ec;
  iStack_1c0 = iStack_6c;
  iStack_1bc = iStack_44;
  iStack_19c = iStack_40;
  iStack_17c = iStack_3c;
  iStack_174 = local_f8;
  iStack_164 = local_78;
  iStack_15c = iStack_38;
  iStack_154 = iStack_f4;
  iStack_144 = iStack_74;
  iStack_13c = iStack_34;
  fadst8x8_sse4_1((__m128i *)&local_138,(__m128i *)&local_238,0xd,2);
LAB_0041770f:
  *(ulong *)coeff = CONCAT44(iStack_234,local_238);
  *(ulong *)(coeff + 2) = CONCAT44(iStack_22c,iStack_230);
  *(ulong *)(coeff + 4) = CONCAT44(iStack_224,local_228);
  *(ulong *)(coeff + 6) = CONCAT44(iStack_21c,iStack_220);
  *(ulong *)(coeff + 8) = CONCAT44(iStack_214,local_218);
  *(ulong *)(coeff + 10) = CONCAT44(iStack_20c,iStack_210);
  *(ulong *)(coeff + 0xc) = CONCAT44(iStack_204,local_208);
  *(ulong *)(coeff + 0xe) = CONCAT44(iStack_1fc,iStack_200);
  *(ulong *)(coeff + 0x10) = CONCAT44(iStack_1f4,local_1f8);
  *(ulong *)(coeff + 0x12) = CONCAT44(iStack_1ec,iStack_1f0);
  *(ulong *)(coeff + 0x14) = CONCAT44(iStack_1e4,local_1e8);
  *(ulong *)(coeff + 0x16) = CONCAT44(iStack_1dc,iStack_1e0);
  *(ulong *)(coeff + 0x18) = CONCAT44(iStack_1d4,local_1d8);
  *(ulong *)(coeff + 0x1a) = CONCAT44(iStack_1cc,iStack_1d0);
  *(ulong *)(coeff + 0x1c) = CONCAT44(iStack_1c4,local_1c8);
  *(ulong *)(coeff + 0x1e) = CONCAT44(iStack_1bc,iStack_1c0);
  *(ulong *)(coeff + 0x20) = CONCAT44(iStack_1b4,local_1b8);
  *(ulong *)(coeff + 0x22) = CONCAT44(iStack_1ac,iStack_1b0);
  *(ulong *)(coeff + 0x24) = CONCAT44(iStack_1a4,local_1a8);
  *(ulong *)(coeff + 0x26) = CONCAT44(iStack_19c,iStack_1a0);
  *(ulong *)(coeff + 0x28) = CONCAT44(iStack_194,local_198);
  *(ulong *)(coeff + 0x2a) = CONCAT44(iStack_18c,iStack_190);
  *(ulong *)(coeff + 0x2c) = CONCAT44(iStack_184,local_188);
  *(ulong *)(coeff + 0x2e) = CONCAT44(iStack_17c,iStack_180);
  *(ulong *)(coeff + 0x30) = CONCAT44(iStack_174,local_178);
  *(ulong *)(coeff + 0x32) = CONCAT44(iStack_16c,iStack_170);
  *(ulong *)(coeff + 0x34) = CONCAT44(iStack_164,local_168);
  *(ulong *)(coeff + 0x36) = CONCAT44(iStack_15c,iStack_160);
  *(ulong *)(coeff + 0x38) = CONCAT44(iStack_154,local_158);
  *(ulong *)(coeff + 0x3a) = CONCAT44(iStack_14c,iStack_150);
  *(ulong *)(coeff + 0x3c) = CONCAT44(iStack_144,local_148);
  *(ulong *)(coeff + 0x3e) = CONCAT44(iStack_13c,iStack_140);
switchD_004141ac_default:
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case IDTX:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}